

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::anon_unknown_8::LogFileObject::Flush(LogFileObject *this)

{
  time_point local_20;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> l;
  LogFileObject *this_local;
  
  l._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mutex_);
  local_20.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  FlushUnlocked(this,&local_20);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void LogFileObject::Flush() {
  std::lock_guard<std::mutex> l{mutex_};
  FlushUnlocked(std::chrono::system_clock::now());
}